

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O1

void __thiscall
cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::Matcher
          (Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits> *this,string_ref query,
          MatcherOptions *opts)

{
  char *pcVar1;
  Iterator first;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  
  (this->super_MatchInfo)._vptr_MatchInfo = (_func_int **)&PTR__Matcher_0014abc8;
  (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->item_basename_)._M_current = (char *)0x0;
  (this->props_).
  super__Vector_base<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->props_).
  super__Vector_base<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->props_).
  super__Vector_base<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->qit_basename_)._M_current = (char *)0x0;
  (this->qit_basename_words_).
  super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->qit_basename_words_).
  super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->qit_basename_words_).
  super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  decode<cpsm::SimpleStringTraits>(&this->query_,query);
  pcVar2 = (this->query_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar1 = (this->query_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->query_basename_)._M_current = pcVar2;
  lVar4 = (long)pcVar1 - (long)pcVar2 >> 2;
  pcVar3 = pcVar2;
  if (0 < lVar4) {
    pcVar3 = pcVar2 + ((long)pcVar1 - (long)pcVar2 & 0xfffffffffffffffc);
    lVar4 = lVar4 + 1;
    pcVar2 = pcVar2 + 3;
    do {
      if ((byte)(pcVar2[-3] + 0xbfU) < 0x1a) {
        pcVar2 = pcVar2 + -3;
        goto LAB_00137b48;
      }
      if ((byte)(pcVar2[-2] + 0xbfU) < 0x1a) {
        pcVar2 = pcVar2 + -2;
        goto LAB_00137b48;
      }
      if ((byte)(pcVar2[-1] + 0xbfU) < 0x1a) {
        pcVar2 = pcVar2 + -1;
        goto LAB_00137b48;
      }
      if ((byte)(*pcVar2 + 0xbfU) < 0x1a) goto LAB_00137b48;
      lVar4 = lVar4 + -1;
      pcVar2 = pcVar2 + 4;
    } while (1 < lVar4);
  }
  lVar4 = (long)pcVar1 - (long)pcVar3;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pcVar2 = pcVar1;
      if ((lVar4 != 3) || (pcVar2 = pcVar3, (byte)(*pcVar3 + 0xbfU) < 0x1a)) goto LAB_00137b48;
      pcVar3 = pcVar3 + 1;
    }
    pcVar2 = pcVar3;
    if ((byte)(*pcVar3 + 0xbfU) < 0x1a) goto LAB_00137b48;
    pcVar3 = pcVar3 + 1;
  }
  pcVar2 = pcVar3;
  if (0x19 < (byte)(*pcVar3 + 0xbfU)) {
    pcVar2 = pcVar1;
  }
LAB_00137b48:
  this->case_sensitive_ = pcVar2 != pcVar1;
  decode<cpsm::SimpleStringTraits>(&this->crfile_,opts->crfile);
  first._M_current =
       (this->crfile_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->crfile_basename_)._M_current = first._M_current;
  (this->crfile_ext_)._M_current = first._M_current;
  find_word_endings(&this->crfile_basename_word_ends_,first,first);
  this->match_crfile_ = opts->match_crfile;
  return;
}

Assistant:

explicit Matcher(boost::string_ref const query, MatcherOptions const& opts)
      // Queries are smartcased (case-sensitive only if any uppercase appears
      // in the query).
      : query_(decode<StringTraits>(query)),
        query_basename_(path_basename<PathTraits>(query_.cbegin(),
                                                  query_.cend())),
        case_sensitive_(std::any_of(query_.cbegin(), query_.cend(),
                                    StringTraits::is_uppercase)),
        crfile_(decode<StringTraits>(opts.crfile)),
        crfile_basename_(path_basename<PathTraits>(crfile_.cbegin(),
                                                   crfile_.cend())),
        crfile_ext_(std::find_if(crfile_.crbegin(),
                                 ReverseIterator(crfile_basename_),
                                 PathTraits::is_extension_separator).base()),
        crfile_basename_word_ends_(find_word_endings(crfile_basename_,
                                                     crfile_ext_)),
        match_crfile_(opts.match_crfile) {}